

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_pointers_t.c
# Opt level: O2

void run_tests(int mode,char *mode_desc)

{
  MMDB_description_s *pMVar1;
  uint uVar2;
  char *db_file;
  MMDB_s *mmdb;
  
  db_file = test_database_path("MaxMind-DB-test-metadata-pointers.mmdb");
  mmdb = open_ok(db_file,mode,mode_desc);
  free(db_file);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
            ,0xd,(mmdb->metadata).database_type,"Lots of pointers in metadata",
            "decoded pointer database_type",0);
  uVar2 = 0;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if ((mmdb->metadata).description.count <= (ulong)uVar2) break;
    pMVar1 = (mmdb->metadata).description.descriptions[uVar2];
    is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
              ,0x14,pMVar1->description,"Lots of pointers in metadata","%s description",
              pMVar1->language,0);
    uVar2 = uVar2 + 1;
  }
  MMDB_close(mmdb);
  free(mmdb);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-test-metadata-pointers.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    char *repeated_string = "Lots of pointers in metadata";

    is(mmdb->metadata.database_type,
       repeated_string,
       "decoded pointer database_type");

    for (uint16_t i = 0; i < mmdb->metadata.description.count; i++) {
        const char *language =
            mmdb->metadata.description.descriptions[i]->language;
        const char *description =
            mmdb->metadata.description.descriptions[i]->description;
        is(description, repeated_string, "%s description", language);
    }

    MMDB_close(mmdb);
    free(mmdb);
}